

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O2

void __thiscall Clasp::Clause::reason(Clause *this,Solver *s,Literal p,LitVec *out)

{
  uint uVar1;
  uint32 *puVar2;
  Literal *pLVar3;
  Literal *pLVar4;
  Literal *r_1;
  Literal *r;
  LitRange LVar5;
  Literal local_3c;
  Solver *local_38;
  
  local_3c.rep_ =
       (this->super_ClauseHead).head_[((this->super_ClauseHead).head_[0].rep_ ^ p.rep_) < 2].rep_ &
       0xfffffffe ^ 2;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(out,&local_3c);
  uVar1 = (this->super_ClauseHead).head_[2].rep_;
  if (3 < uVar1) {
    local_3c.rep_ = uVar1 & 0xfffffffe ^ 2;
    local_38 = s;
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(out,&local_3c);
    LVar5 = tail(this);
    pLVar4 = LVar5.second;
    for (pLVar3 = LVar5.first; s = local_38, pLVar3 != pLVar4; pLVar3 = pLVar3 + 1) {
      local_3c.rep_ = pLVar3->rep_ & 0xfffffffe ^ 2;
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(out,&local_3c);
    }
    if ((~(this->super_ClauseHead).field_0.local_.mem[0] & 3) == 0) {
      do {
        local_3c.rep_ = pLVar4->rep_ & 0xfffffffe ^ 2;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (out,&local_3c);
        puVar2 = &pLVar4->rep_;
        pLVar4 = pLVar4 + 1;
      } while ((*puVar2 & 1) == 0);
    }
  }
  if (((this->super_ClauseHead).info_.super_ConstraintScore.rep & 0x30000000) != 0) {
    Solver::updateOnReason(s,&(this->super_ClauseHead).info_.super_ConstraintScore,p,out);
  }
  return;
}

Assistant:

void Clause::reason(Solver& s, Literal p, LitVec& out) {
	out.push_back(~head_[p == head_[0]]);
	if (!isSentinel(head_[2])) {
		out.push_back(~head_[2]);
		LitRange t = tail();
		for (const Literal* r = t.first; r != t.second; ++r) {
			out.push_back(~*r);
		}
		if (contracted()) {
			const Literal* r = t.second;
			do { out.push_back(~*r); } while (!r++->flagged());
		}
	}
	if (learnt()) {
		s.updateOnReason(info_.score(), p, out);
	}
}